

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectedGraph.h
# Opt level: O2

bool __thiscall
netlist::DirectedGraph<netlist::NetlistNode,_netlist::NetlistEdge>::getInEdgesToNode
          (DirectedGraph<netlist::NetlistNode,_netlist::NetlistEdge> *this,NetlistNode *targetNode,
          vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_> *results)

{
  pointer puVar1;
  pointer ppNVar2;
  pointer ppNVar3;
  unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_> *node;
  pointer puVar4;
  vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_> tempResults;
  _Vector_base<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (NetlistEdge **)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (NetlistEdge **)0x0;
  puVar1 = (this->nodes).
           super__Vector_base<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->nodes).
                super__Vector_base<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    Node<netlist::NetlistNode,_netlist::NetlistEdge>::getEdgesTo
              (&((puVar4->_M_t).
                 super___uniq_ptr_impl<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_netlist::NetlistNode_*,_std::default_delete<netlist::NetlistNode>_>
                 .super__Head_base<0UL,_netlist::NetlistNode_*,_false>._M_head_impl)->
                super_Node<netlist::NetlistNode,_netlist::NetlistEdge>,targetNode,
               (vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_> *)&local_48)
    ;
    std::vector<netlist::NetlistEdge*,std::allocator<netlist::NetlistEdge*>>::
    insert<__gnu_cxx::__normal_iterator<netlist::NetlistEdge**,std::vector<netlist::NetlistEdge*,std::allocator<netlist::NetlistEdge*>>>,void>
              ((vector<netlist::NetlistEdge*,std::allocator<netlist::NetlistEdge*>> *)results,
               (const_iterator)
               (results->
               super__Vector_base<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_>).
               _M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<netlist::NetlistEdge_**,_std::vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_>_>
                )local_48._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<netlist::NetlistEdge_**,_std::vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_>_>
                )local_48._M_impl.super__Vector_impl_data._M_finish);
    if (local_48._M_impl.super__Vector_impl_data._M_finish !=
        local_48._M_impl.super__Vector_impl_data._M_start) {
      local_48._M_impl.super__Vector_impl_data._M_finish =
           local_48._M_impl.super__Vector_impl_data._M_start;
    }
  }
  ppNVar2 = (results->
            super__Vector_base<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppNVar3 = (results->
            super__Vector_base<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  std::_Vector_base<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_>::~_Vector_base
            (&local_48);
  return ppNVar2 != ppNVar3;
}

Assistant:

bool getInEdgesToNode(const NodeType& targetNode, std::vector<EdgeType*>& results) const {
        SLANG_ASSERT(results.empty() && "Expected the results parameter to be empty");
        std::vector<EdgeType*> tempResults;
        for (auto& node : nodes) {
            node->getEdgesTo(targetNode, tempResults);
            results.insert(results.end(), tempResults.begin(), tempResults.end());
            tempResults.clear();
        }
        return !results.empty();
    }